

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

config * newconfig(void)

{
  config *pcVar1;
  config *pcVar2;
  
  pcVar1 = freelist;
  if (freelist == (config *)0x0) {
    pcVar2 = (config *)0x3;
    pcVar1 = (config *)calloc(3,0x48);
    if (pcVar1 == (config *)0x0) {
      freelist = pcVar1;
      newconfig_cold_1();
      pcVar1 = freelist;
      pcVar2->next = freelist;
      freelist = pcVar2;
      return pcVar1;
    }
    pcVar1->next = pcVar1 + 1;
    pcVar1[1].next = pcVar1 + 2;
  }
  freelist = pcVar1->next;
  return pcVar1;
}

Assistant:

config *newconfig(){
  struct config *newcfg;
  if( freelist==0 ){
    int i;
    int amt = 3;
    freelist = (struct config *)calloc( amt, sizeof(struct config) );
    if( freelist==0 ){
      fprintf(stderr,"Unable to allocate memory for a new configuration.");
      exit(1);
    }
    for(i=0; i<amt-1; i++) freelist[i].next = &freelist[i+1];
    freelist[amt-1].next = 0;
  }
  newcfg = freelist;
  freelist = freelist->next;
  return newcfg;
}